

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_loadk64(ASMState *as,Reg r,IRIns *ir)

{
  MCode *pMVar1;
  IRIns *addr;
  byte bVar2;
  int iVar3;
  x86Op xo_00;
  uint64_t *k;
  x86Op xo;
  Reg r64;
  IRIns *ir_local;
  Reg r_local;
  ASMState *as_local;
  
  addr = ir + 1;
  bVar2 = (byte)r;
  if ((0xffff0000U >> (bVar2 & 0x1f) & 1) == 0) {
    k._4_4_ = r | 0x80200;
    k._0_4_ = XO_MOV;
  }
  else {
    k._0_4_ = XO_MOVSD;
    k._4_4_ = r;
  }
  if (*addr == (IRIns)0x0) {
    xo_00 = 0x330000fe;
    if ((0xffff0000U >> (bVar2 & 0x1f) & 1) != 0) {
      xo_00 = XO_XORPS;
    }
    emit_rr(as,xo_00,r,r);
  }
  else {
    iVar3 = (int)addr;
    if (((addr == (IRIns *)(long)iVar3) ||
        ((long)addr - (long)&as->J[1].L == (long)(iVar3 - ((int)as->J + 0xcc8)))) ||
       (((long)addr - (long)as->mcp == (long)(iVar3 - (int)as->mcp) &&
        ((long)addr - (long)as->mctop == (long)(iVar3 - (int)as->mctop))))) {
      emit_rma(as,(x86Op)k,k._4_4_,addr);
    }
    else {
      if ((ir->field_1).op12 == 0) {
        if ((as->curins <= as->stopins) && ((0xbfefU >> (bVar2 & 0x1f) & 1) != 0)) {
          emit_loadu64(as,r,(uint64_t)*addr);
          return;
        }
        while (((ulong)as->mcbot & 7) != 0) {
          pMVar1 = as->mcbot;
          as->mcbot = pMVar1 + 1;
          *pMVar1 = 0xcc;
        }
        *(IRIns *)as->mcbot = *addr;
        (ir->field_1).op12 = (int)as->mctop - (int)as->mcbot;
        as->mcbot = as->mcbot + 8;
        as->mclim = as->mcbot + 0x40;
        as->J->mcbot = as->mcbot;
      }
      emit_rmro(as,(x86Op)k,k._4_4_,0x25,((int)as->mctop - (ir->field_1).op12) - (int)as->mcp);
    }
  }
  return;
}

Assistant:

static void emit_loadk64(ASMState *as, Reg r, IRIns *ir)
{
  Reg r64;
  x86Op xo;
  const uint64_t *k = &ir_k64(ir)->u64;
  if (rset_test(RSET_FPR, r)) {
    r64 = r;
    xo = XO_MOVSD;
  } else {
    r64 = r | REX_64;
    xo = XO_MOV;
  }
  if (*k == 0) {
    emit_rr(as, rset_test(RSET_FPR, r) ? XO_XORPS : XO_ARITH(XOg_XOR), r, r);
#if LJ_GC64
  } else if (checki32((intptr_t)k) || checki32(dispofs(as, k)) ||
	     (checki32(mcpofs(as, k)) && checki32(mctopofs(as, k)))) {
    emit_rma(as, xo, r64, k);
  } else {
    if (ir->i) {
      lj_assertA(*k == *(uint64_t*)(as->mctop - ir->i),
		 "bad interned 64 bit constant");
    } else if (as->curins <= as->stopins && rset_test(RSET_GPR, r)) {
      emit_loadu64(as, r, *k);
      return;
    } else {
      /* If all else fails, add the FP constant at the MCode area bottom. */
      while ((uintptr_t)as->mcbot & 7) *as->mcbot++ = XI_INT3;
      *(uint64_t *)as->mcbot = *k;
      ir->i = (int32_t)(as->mctop - as->mcbot);
      as->mcbot += 8;
      as->mclim = as->mcbot + MCLIM_REDZONE;
      lj_mcode_commitbot(as->J, as->mcbot);
    }
    emit_rmro(as, xo, r64, RID_RIP, (int32_t)mcpofs(as, as->mctop - ir->i));
#else
  } else {
    emit_rma(as, xo, r64, k);
#endif
  }